

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O2

void __thiscall QHostInfo::QHostInfo(QHostInfo *this,int id)

{
  QHostInfoPrivate *this_00;
  QHostInfoPrivate *d;
  
  this_00 = (QHostInfoPrivate *)operator_new(0x58);
  QHostInfoPrivate::QHostInfoPrivate(this_00);
  this->d_ptr = this_00;
  this_00->lookupId = id;
  return;
}

Assistant:

QHostInfo::QHostInfo(int id)
    : d_ptr(new QHostInfoPrivate)
{
    Q_D(QHostInfo);
    d->lookupId = id;
}